

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O2

int tool_progress_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  uint uVar1;
  long lVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  timeval newer;
  char line [257];
  char format [40];
  
  lVar11 = 0x7fffffffffffffff;
  newer = tvnow();
  lVar2 = *(long *)((long)clientp + 0x10);
  lVar7 = *(long *)((long)clientp + 0xb0);
  if (lVar7 < 0) {
    lVar8 = 0x7fffffffffffffff;
    if (*(int *)((long)clientp + 0x80) == 0) goto LAB_0010b5b5;
LAB_0010b40c:
    if (*(long *)((long)clientp + 0x88) == lVar8) {
      return 0;
    }
    lVar7 = tvdiff(newer,*(timeval *)((long)clientp + 0x90));
    if ((lVar7 < 100) && (lVar8 < lVar11)) {
      return 0;
    }
    goto LAB_0010b5b5;
  }
  lVar11 = lVar7 + ultotal + dltotal;
  if (0x7fffffffffffffff - lVar7 < ultotal + dltotal) {
    lVar11 = 0x7fffffffffffffff;
  }
  lVar8 = lVar7 + ulnow + dlnow;
  if (0x7fffffffffffffff - lVar7 < ulnow + dlnow) {
    lVar8 = 0x7fffffffffffffff;
  }
  if (*(int *)((long)clientp + 0x80) == 0) goto LAB_0010b5b5;
  if (lVar11 != 0) goto LAB_0010b40c;
  lVar11 = tvdiff(newer,*(timeval *)((long)clientp + 0x90));
  if (lVar11 < 100) {
    return 0;
  }
  lVar11 = *(long *)((long)clientp + 0x88);
  iVar5 = *(int *)((long)clientp + 0xa0);
  iVar6 = 0;
  curl_msnprintf(line,0x100,"%*s\r",iVar5 + -1," ");
  builtin_strncpy(line + *(int *)((long)clientp + 0xbc),"-=O=-",5);
  uVar1 = *(uint *)((long)clientp + 0xb8);
  uVar10 = 1000000 / (long)(iVar5 + -2) & 0xffffffff;
  line[(int)(sinus[(ulong)uVar1 % 200] / uVar10)] = '#';
  line[(int)(sinus[(ulong)(uVar1 + 5) % 200] / uVar10)] = '#';
  line[(int)(sinus[(ulong)(uVar1 + 10) % 200] / uVar10)] = '#';
  line[(int)(sinus[(ulong)(uVar1 + 0xf) % 200] / uVar10)] = '#';
  fputs(line,*(FILE **)((long)clientp + 0xa8));
  uVar1 = *(int *)((long)clientp + 0xb8) + 2;
  uVar4 = *(int *)((long)clientp + 0xb8) - 0xc6;
  if (uVar1 < 200) {
    uVar4 = uVar1;
  }
  *(uint *)((long)clientp + 0xb8) = uVar4;
  if (lVar8 != lVar11) {
    iVar6 = *(int *)((long)clientp + 0xc0);
  }
  iVar6 = iVar6 + *(int *)((long)clientp + 0xbc);
  *(int *)((long)clientp + 0xbc) = iVar6;
  iVar5 = *(int *)((long)clientp + 0xa0) + -6;
  if (iVar6 < iVar5) {
    if (iVar6 < 0) {
      iVar5 = 0;
      uVar3 = 1;
      goto LAB_0010b5a5;
    }
  }
  else {
    uVar3 = 0xffffffff;
LAB_0010b5a5:
    *(undefined4 *)((long)clientp + 0xc0) = uVar3;
    *(int *)((long)clientp + 0xbc) = iVar5;
  }
  lVar11 = 0;
LAB_0010b5b5:
  *(int *)((long)clientp + 0x80) = *(int *)((long)clientp + 0x80) + 1;
  if ((0 < lVar11) && (lVar8 != *(long *)((long)clientp + 0x88))) {
    if (lVar11 < lVar8) {
      lVar11 = lVar8;
    }
    iVar9 = *(int *)((long)clientp + 0xa0) + -7;
    iVar6 = (int)((double)iVar9 * ((double)lVar8 / (double)lVar11));
    iVar5 = 0x100;
    if (iVar6 < 0x100) {
      iVar5 = iVar6;
    }
    memset(line,0x23,(long)iVar5);
    line[iVar5] = '\0';
    curl_msnprintf(format,0x28,"\r%%-%ds %%5.1f%%%%",iVar9);
    curl_mfprintf(((double)lVar8 / (double)lVar11) * 100.0,*(undefined8 *)((long)clientp + 0xa8),
                  format,line);
  }
  fflush(*(FILE **)((long)clientp + 0xa8));
  *(long *)((long)clientp + 0x88) = lVar8;
  *(timeval *)((long)clientp + 0x90) = newer;
  if (*(char *)(lVar2 + 0x2fa) == '\x01') {
    *(undefined1 *)(lVar2 + 0x2fa) = 0;
    curl_easy_pause(*(undefined8 *)((long)clientp + 0x18),0);
  }
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  /* The original progress-bar source code was written for curl by Lars Aas,
     and this new edition inherits some of his concepts. */

  struct timeval now = tvnow();
  struct per_transfer *per = clientp;
  struct OperationConfig *config = per->config;
  struct ProgressData *bar = &per->progressbar;
  curl_off_t total;
  curl_off_t point;

  /* Calculate expected transfer size. initial_size can be less than zero
     when indicating that we are expecting to get the filesize from the
     remote */
  if(bar->initial_size < 0 ||
     ((CURL_OFF_T_MAX - bar->initial_size) < (dltotal + ultotal)))
    total = CURL_OFF_T_MAX;
  else
    total = dltotal + ultotal + bar->initial_size;

  /* Calculate the current progress. initial_size can be less than zero when
     indicating that we are expecting to get the filesize from the remote */
  if(bar->initial_size < 0 ||
     ((CURL_OFF_T_MAX - bar->initial_size) < (dlnow + ulnow)))
    point = CURL_OFF_T_MAX;
  else
    point = dlnow + ulnow + bar->initial_size;

  if(bar->calls) {
    /* after first call... */
    if(total) {
      /* we know the total data to get... */
      if(bar->prev == point)
        /* progress didn't change since last invoke */
        return 0;
      else if((tvdiff(now, bar->prevtime) < 100L) && point < total)
        /* limit progress-bar updating to 10 Hz except when we're at 100% */
        return 0;
    }
    else {
      /* total is unknown */
      if(tvdiff(now, bar->prevtime) < 100L)
        /* limit progress-bar updating to 10 Hz */
        return 0;
      fly(bar, point != bar->prev);
    }
  }

  /* simply count invokes */
  bar->calls++;

  if((total > 0) && (point != bar->prev)) {
    char line[MAX_BARLENGTH + 1];
    char format[40];
    double frac;
    double percent;
    int barwidth;
    int num;
    if(point > total)
      /* we have got more than the expected total! */
      total = point;

    frac = (double)point / (double)total;
    percent = frac * 100.0;
    barwidth = bar->width - 7;
    num = (int) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    memset(line, '#', num);
    line[num] = '\0';
    msnprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
    fprintf(bar->out, format, line, percent);
  }
  fflush(bar->out);
  bar->prev = point;
  bar->prevtime = now;

  if(config->readbusy) {
    config->readbusy = FALSE;
    curl_easy_pause(per->curl, CURLPAUSE_CONT);
  }

  return 0;
}